

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_mem clCreateFromGLTexture
                 (cl_context context,cl_mem_flags flags,cl_GLenum target,cl_GLint miplevel,
                 cl_GLuint texture,cl_int *errcode_ret)

{
  bool bVar1;
  CLIntercept *this;
  cl_icd_dispatch *pcVar2;
  _Base_ptr enqueueCounter_00;
  SConfig *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  cl_GLint in_ECX;
  cl_GLenum in_EDX;
  _Base_ptr in_RSI;
  cl_context in_RDI;
  cl_GLuint in_R8D;
  uint *in_R9;
  cl_int in_stack_00000054;
  char *in_stack_00000058;
  CLIntercept *in_stack_00000060;
  cl_mem retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  _Base_ptr in_stack_fffffffffffffe40;
  CLIntercept *in_stack_fffffffffffffe48;
  cl_GLenum in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  cl_GLint in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined8 in_stack_fffffffffffffe80;
  GLenum e;
  CEnumNameMap *in_stack_fffffffffffffe88;
  allocator *paVar6;
  cl_context e_00;
  int local_134;
  string *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  CLIntercept *in_stack_fffffffffffffef0;
  time_point in_stack_fffffffffffffef8;
  time_point in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  time_point tVar7;
  cl_GLuint texture_00;
  time_point in_stack_ffffffffffffff10;
  cl_mem in_stack_ffffffffffffff18;
  CLIntercept *in_stack_ffffffffffffff20;
  duration local_a8;
  time_point local_a0;
  uint local_98 [4];
  string local_88 [16];
  cl_mem in_stack_ffffffffffffff88;
  CLIntercept *in_stack_ffffffffffffff90;
  _Base_ptr enqueueCounter_01;
  CLIntercept *this_00;
  cl_mem local_10;
  
  texture_00 = (cl_GLuint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  e = (GLenum)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar2 = CLIntercept::dispatch(this),
     pcVar2->clCreateFromGLTexture == (cl_api_clCreateFromGLTexture)0x0)) {
    local_134 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_134);
    if (in_R9 != (uint *)0x0) {
      *in_R9 = 0xffffffde;
    }
    local_10 = (cl_mem)0x0;
  }
  else {
    enqueueCounter_00 = (_Base_ptr)CLIntercept::getEnqueueCounter(in_stack_fffffffffffffe48);
    pSVar3 = CLIntercept::config(this);
    enqueueCounter_01 = enqueueCounter_00;
    this_00 = this;
    if ((pSVar3->CallLogging & 1U) != 0) {
      e_00 = in_RDI;
      CLIntercept::enumName(this);
      CEnumNameMap::name_mem_flags_abi_cxx11_
                ((CEnumNameMap *)&stack0xffffffffffffff98,(cl_mem_flags)e_00);
      in_stack_fffffffffffffe40 = in_RSI;
      uVar4 = std::__cxx11::string::c_str();
      in_RSI = in_stack_fffffffffffffe40;
      CLIntercept::enumName(this_00);
      CEnumNameMap::name_gl_abi_cxx11_(in_stack_fffffffffffffe88,e);
      in_stack_fffffffffffffe58 = in_ECX;
      in_stack_fffffffffffffe50 = in_EDX;
      uVar5 = std::__cxx11::string::c_str();
      in_ECX = in_stack_fffffffffffffe58;
      in_EDX = in_stack_fffffffffffffe50;
      CLIntercept::callLoggingEnter
                (this,"clCreateFromGLTexture",(uint64_t)enqueueCounter_00,(cl_kernel)0x0,
                 "context = %p, flags = %s (%llX), texture_target = %s (%d), miplevel = %d, texture = %d"
                 ,e_00,uVar4,in_stack_fffffffffffffe40,uVar5,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe58,in_R8D);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    }
    local_98[0] = 0;
    pSVar3 = CLIntercept::config(this_00);
    if ((((((pSVar3->CallLogging & 1U) != 0) ||
          (pSVar3 = CLIntercept::config(this_00), (pSVar3->ErrorLogging & 1U) != 0)) ||
         (pSVar3 = CLIntercept::config(this_00), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this_00), (pSVar3->NoErrors & 1U) != 0)) &&
       (in_R9 == (uint *)0x0)) {
      in_R9 = local_98;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffe40);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffe40);
    pSVar3 = CLIntercept::config(this_00);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this_00), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      local_a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    pcVar2 = CLIntercept::dispatch(this_00);
    local_10 = (*pcVar2->clCreateFromGLTexture)
                         (in_RDI,(cl_mem_flags)in_RSI,in_EDX,in_ECX,in_R8D,(cl_int *)in_R9);
    pSVar3 = CLIntercept::config(this_00);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this_00), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      local_a8.__r = std::chrono::_V2::steady_clock::now();
      pSVar3 = CLIntercept::config(this_00);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                            (this_00,(uint64_t)enqueueCounter_01), bVar1)) {
        paVar6 = (allocator *)&stack0xffffffffffffff1f;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xffffffffffffff20,"",paVar6);
        tVar7.__d.__r = (duration)(duration)local_a8.__r;
        in_stack_ffffffffffffff10.__d.__r = local_a0.__d.__r;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff00.__d.__r,
                   (char *)in_stack_fffffffffffffef8.__d.__r,(string *)in_stack_fffffffffffffef0,
                   local_a0,(time_point)local_a8.__r);
        texture_00 = (cl_GLuint)((ulong)tVar7.__d.__r >> 0x20);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
      }
    }
    if ((local_10 != (cl_mem)0x0) &&
       (((pSVar3 = CLIntercept::config(this_00), (pSVar3->DumpImagesBeforeEnqueue & 1U) != 0 ||
         (pSVar3 = CLIntercept::config(this_00), (pSVar3->DumpImagesAfterEnqueue & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this_00), (pSVar3->CaptureReplay & 1U) != 0)))) {
      CLIntercept::addImage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    pSVar3 = CLIntercept::config(this_00);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this_00), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this_00), (pSVar3->NoErrors & 1U) != 0)) && (*in_R9 != 0)) {
      pSVar3 = CLIntercept::config(this_00);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000060,in_stack_00000058,in_stack_00000054);
      }
      pSVar3 = CLIntercept::config(this_00);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this_00);
      if ((pSVar3->NoErrors & 1U) != 0) {
        *in_R9 = 0;
      }
    }
    pSVar3 = CLIntercept::config(this_00);
    if ((pSVar3->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(this_00);
      CObjectTracker::AddAllocation<_cl_mem*>
                ((CObjectTracker *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (_cl_mem *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
    CLIntercept::logCL_GLTextureDetails
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (cl_GLenum)((ulong)in_stack_ffffffffffffff10.__d.__r >> 0x20),
               SUB84(in_stack_ffffffffffffff10.__d.__r,0),texture_00);
    pSVar3 = CLIntercept::config(this_00);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (this_00,"clCreateFromGLTexture",(cl_int)(ulong)*in_R9,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",local_10);
    }
    pSVar3 = CLIntercept::config(this_00);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffee8,"",(allocator *)&stack0xfffffffffffffee7);
      CLIntercept::chromeCallLoggingExit
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 local_a0.__d.__r._7_1_,local_a8.__r,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
    }
  }
  return local_10;
}

Assistant:

CL_API_ENTRY cl_mem CL_API_CALL CLIRN(clCreateFromGLTexture)(
    cl_context context,
    cl_mem_flags flags,
    cl_GLenum target,
    cl_GLint miplevel,
    cl_GLuint texture,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clCreateFromGLTexture )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER(
            "context = %p, "
            "flags = %s (%llX), "
            "texture_target = %s (%d), "
            "miplevel = %d, "
            "texture = %d",
            context,
            pIntercept->enumName().name_mem_flags( flags ).c_str(),
            flags,
            pIntercept->enumName().name_gl( target ).c_str(),
            target,
            miplevel,
            texture );

        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_mem  retVal = pIntercept->dispatch().clCreateFromGLTexture(
            context,
            flags,
            target,
            miplevel,
            texture,
            errcode_ret);

        HOST_PERFORMANCE_TIMING_END();
        ADD_IMAGE( retVal );
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );

        pIntercept->logCL_GLTextureDetails( retVal, target, miplevel, texture );

        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}